

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry3D.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Geometry3D_Box(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer pFVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  CX3DImporter_NodeElement_Geometry3D *pCVar6;
  allocator local_c9;
  string local_c8;
  undefined4 local_a8;
  allocator local_a1;
  undefined1 local_a0 [8];
  string an;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  undefined1 local_60 [8];
  aiVector3D size;
  bool solid;
  string use;
  string def;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(use.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&size.z);
  size.y._3_1_ = 1;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_60,2.0,2.0,2.0);
  _idx_end = (CX3DImporter_NodeElement_Geometry3D *)0x0;
  an.field_2._12_4_ = 0;
  pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  an.field_2._8_4_ =
       (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)an.field_2._12_4_ < (int)an.field_2._8_4_; an.field_2._12_4_ = an.field_2._12_4_ + 1)
  {
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar4,(ulong)(uint)an.field_2._12_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_a0,(char *)CONCAT44(extraout_var,iVar2),&local_a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a0,"DEF");
    if (bVar1) {
      pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar4,(ulong)(uint)an.field_2._12_4_);
      std::__cxx11::string::operator=
                ((string *)(use.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_00,iVar2));
      local_a8 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a0,"USE");
      if (bVar1) {
        pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar4,(ulong)(uint)an.field_2._12_4_);
        std::__cxx11::string::operator=((string *)&size.z,(char *)CONCAT44(extraout_var_01,iVar2));
        local_a8 = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a0,"bboxCenter");
        if (bVar1) {
          local_a8 = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_a0,"bboxSize");
          if (bVar1) {
            local_a8 = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_a0,"containerField");
            if (bVar1) {
              local_a8 = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_a0,"size");
              if (bVar1) {
                XML_ReadNode_GetAttrVal_AsVec3f(this,an.field_2._12_4_,(aiVector3D *)local_60);
                local_a8 = 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_a0,"solid");
                if (bVar1) {
                  size.y._3_1_ = XML_ReadNode_GetAttrVal_AsBool(this,an.field_2._12_4_);
                  local_a8 = 4;
                }
                else {
                  Throw_IncorrectAttr(this,(string *)local_a0);
                  local_a8 = 0;
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_a0);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)&size.z,ENET_Box,(CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)&size.z);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    pCVar6 = (CX3DImporter_NodeElement_Geometry3D *)operator_new(0x78);
    CX3DImporter_NodeElement_Geometry3D::CX3DImporter_NodeElement_Geometry3D
              (pCVar6,ENET_Box,this->NodeElement_Cur);
    _idx_end = pCVar6;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&(_idx_end->super_CX3DImporter_NodeElement).ID,
                 (string *)(use.field_2._M_local_buf + 8));
    }
    GeometryHelper_MakeQL_RectParallelepiped(this,(aiVector3D *)local_60,&_idx_end->Vertices);
    _idx_end->Solid = (bool)(size.y._3_1_ & 1);
    _idx_end->NumIndices = 4;
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar3 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar6 = _idx_end;
    if ((uVar3 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c8,"Box",&local_c9);
      ParseNode_Metadata(this,&pCVar6->super_CX3DImporter_NodeElement,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::__cxx11::string::~string((string *)&size.z);
  std::__cxx11::string::~string((string *)(use.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry3D_Box()
{
    std::string def, use;
    bool solid = true;
    aiVector3D size(2, 2, 2);
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_REF("size", size, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Box, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry3D(CX3DImporter_NodeElement::ENET_Box, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		GeometryHelper_MakeQL_RectParallelepiped(size, ((CX3DImporter_NodeElement_Geometry3D*)ne)->Vertices);// get quad list
		((CX3DImporter_NodeElement_Geometry3D*)ne)->Solid = solid;
		((CX3DImporter_NodeElement_Geometry3D*)ne)->NumIndices = 4;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Box");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}